

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudio_internal.c
# Opt level: O0

void FAudio_INTERNAL_DecodePCM32F
               (FAudioVoice *voice,FAudioBuffer *buffer,float *decodeCache,uint32_t samples)

{
  uint in_ECX;
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  
  SDL_memcpy(in_RDX,*(long *)(in_RSI + 8) +
                    (ulong)(*(int *)(in_RDI + 0xf0) *
                           (uint)*(ushort *)(*(long *)(in_RDI + 0xf8) + 2)) * 4,
             (ulong)in_ECX * 4 * (ulong)*(ushort *)(*(long *)(in_RDI + 0xf8) + 2));
  return;
}

Assistant:

void FAudio_INTERNAL_DecodePCM32F(
	FAudioVoice *voice,
	FAudioBuffer *buffer,
	float *decodeCache,
	uint32_t samples
) {
	LOG_FUNC_ENTER(voice->audio)
	FAudio_memcpy(
		decodeCache,
		((float*) buffer->pAudioData) + (
			voice->src.curBufferOffset * voice->src.format->nChannels
		),
		sizeof(float) * samples * voice->src.format->nChannels
	);
	LOG_FUNC_EXIT(voice->audio)
}